

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
bioparser::Parser<biosoup::Sequence>::Store(Parser<biosoup::Sequence> *this,size_t count,bool strip)

{
  uint32_t uVar1;
  ulong uVar2;
  invalid_argument *this_00;
  pointer pcVar3;
  pointer pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t str_len;
  
  uVar5 = (ulong)this->buffer_ptr_;
  pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar3) < uVar5 + count) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: buffer overflow");
  }
  else {
    uVar6 = (ulong)this->storage_ptr_;
    if (uVar6 + count >> 0x20 == 0) {
      pcVar4 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = (long)(this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar4;
      if (uVar2 < uVar6 + count) {
        std::vector<char,_std::allocator<char>_>::resize(&this->storage_,uVar2 * 2);
        uVar6 = (ulong)this->storage_ptr_;
        pcVar4 = (this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (ulong)this->buffer_ptr_;
        pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      memcpy(pcVar4 + uVar6,pcVar3 + uVar5,count);
      str_len = (uint32_t)count;
      uVar1 = str_len;
      if (strip) {
        uVar1 = RightStrip((this->storage_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start + this->storage_ptr_,str_len);
      }
      this->storage_ptr_ = this->storage_ptr_ + uVar1;
      this->buffer_ptr_ = this->buffer_ptr_ + str_len + 1;
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[bioparser::Parser::Store] error: storage overflow");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Store(std::size_t count, bool strip = false) {
    if (buffer_ptr_ + count > buffer_.size()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: buffer overflow");
    }
    if (storage_ptr_ + count > std::numeric_limits<std::uint32_t>::max()) {
      throw std::invalid_argument(
          "[bioparser::Parser::Store] error: storage overflow");
    }
    if (storage_ptr_ + count > storage_.size()) {
      storage_.resize(2 * storage_.size());
    }
    std::memcpy(&storage_[storage_ptr_], &buffer_[buffer_ptr_], count);
    storage_ptr_ += strip ? RightStrip(&storage_[storage_ptr_], count) : count;
    buffer_ptr_ += count + 1;  // ignore sought character
  }